

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void separatetobefnz(lua_State *L,int all)

{
  global_State *pgVar1;
  GCObject **ppGVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  GCObject *pGVar5;
  
  pgVar1 = L->l_G;
  pGVar5 = (GCObject *)&pgVar1->tobefnz;
  do {
    pGVar4 = pGVar5;
    pGVar5 = (pGVar4->gch).next;
  } while ((pGVar4->gch).next != (GCObject *)0x0);
  pGVar5 = pgVar1->finobj;
  if (pGVar5 != (GCObject *)0x0) {
    ppGVar2 = &pgVar1->finobj;
    do {
      pGVar3 = pGVar5;
      if (((pGVar5->gch).marked & 3) != 0 || all != 0) {
        (pGVar5->gch).marked = (pGVar5->gch).marked | 8;
        *ppGVar2 = (pGVar5->gch).next;
        (pGVar5->gch).next = (pGVar4->gch).next;
        (pGVar4->gch).next = pGVar5;
        pGVar3 = (GCObject *)ppGVar2;
        pGVar4 = pGVar5;
      }
      pGVar5 = (pGVar3->gch).next;
      ppGVar2 = (GCObject **)pGVar3;
    } while (pGVar5 != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void separatetobefnz (lua_State *L, int all) {
  global_State *g = G(L);
  GCObject **p = &g->finobj;
  GCObject *curr;
  GCObject **lastnext = &g->tobefnz;
  /* find last 'next' field in 'tobefnz' list (to add elements in its end) */
  while (*lastnext != NULL)
    lastnext = &gch(*lastnext)->next;
  while ((curr = *p) != NULL) {  /* traverse all finalizable objects */
    lua_assert(!isfinalized(curr));
    lua_assert(testbit(gch(curr)->marked, SEPARATED));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &gch(curr)->next;  /* don't bother with it */
    else {
      l_setbit(gch(curr)->marked, FINALIZEDBIT); /* won't be finalized again */
      *p = gch(curr)->next;  /* remove 'curr' from 'finobj' list */
      gch(curr)->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &gch(curr)->next;
    }
  }
}